

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * random_bigPrime(BigInt *__return_storage_ptr__,int bit_size)

{
  bool bVar1;
  vector<long_long,_std::allocator<long_long>_> *ctx;
  BigInt local_48;
  undefined1 local_15;
  int local_14;
  BigInt *pBStack_10;
  int bit_size_local;
  BigInt *rand;
  
  ctx = &seive;
  local_14 = bit_size;
  pBStack_10 = __return_storage_ptr__;
  bVar1 = std::vector<long_long,_std::allocator<long_long>_>::empty(&seive);
  if (bVar1) {
    init((EVP_PKEY_CTX *)ctx);
  }
  local_15 = 0;
  random_bigint(__return_storage_ptr__,local_14 / 3);
  while (bVar1 = isPrime(__return_storage_ptr__,0x40), ((bVar1 ^ 0xffU) & 1) != 0) {
    BigInt::operator+(&local_48,__return_storage_ptr__,&one);
    BigInt::operator=(__return_storage_ptr__,&local_48);
    BigInt::~BigInt(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt random_bigPrime(int bit_size) {
    if (seive.empty())
        init();

    BigInt rand(random_bigint(bit_size / 3)); //! bit_size/3 decimal digits log2(10) ~ 3
    while (!isPrime(rand))
        rand = rand + one; //! bit_size/3 decimal digits
    return rand;
}